

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  lu_int32 *plVar1;
  byte bVar2;
  global_State *pgVar3;
  Node *osize;
  long lVar4;
  GCObject *c;
  
  c = *p;
  if (c != (GCObject *)0x0) {
    pgVar3 = L->l_G;
    bVar2 = pgVar3->currentwhite;
    lVar4 = count + 1;
    do {
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        return (GCObject **)(GCObject *)p;
      }
      if ((c->gch).tt == '\b') {
        sweeplist(L,&(c->th).openupval,0xfffffffffffffffd);
      }
      if ((byte)(((c->gch).marked ^ 3) & (bVar2 ^ 3)) != 0) {
        (c->gch).marked = pgVar3->currentwhite & 3 | (c->gch).marked & 0xf8;
        p = (GCObject **)c;
        goto switchD_0010998f_default;
      }
      ((GCheader *)p)->next = (c->gch).next;
      if (c == pgVar3->rootgc) {
        pgVar3->rootgc = (c->gch).next;
      }
      switch((c->gch).tt) {
      case '\x04':
        plVar1 = &(L->l_G->strt).nuse;
        *plVar1 = *plVar1 - 1;
        osize = (Node *)((long)&((c->h).metatable)->array + 1);
        goto LAB_001099c6;
      case '\x05':
        luaH_free(L,&c->h);
        break;
      case '\x06':
        luaF_freeclosure(L,&c->cl);
        break;
      case '\a':
        osize = (c->h).node + 1;
LAB_001099c6:
        luaM_realloc_(L,c,(size_t)osize,0);
        break;
      case '\b':
        luaE_freethread(L,&c->th);
        break;
      case '\t':
        luaF_freeproto(L,&c->p);
        break;
      case '\n':
        luaF_freeupval(L,&c->uv);
      }
switchD_0010998f_default:
      c = ((GCheader *)p)->next;
    } while (c != (GCObject *)0x0);
  }
  return (GCObject **)(GCObject *)p;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  GCObject *curr;
  global_State *g = G(L);
  int deadmask = otherwhite(g);
  while ((curr = *p) != NULL && count-- > 0) {
    if (curr->gch.tt == LUA_TTHREAD)  /* sweep open upvalues of each thread */
      sweepwholelist(L, &gco2th(curr)->openupval);
    if ((curr->gch.marked ^ WHITEBITS) & deadmask) {  /* not dead? */
      lua_assert(!isdead(g, curr) || testbit(curr->gch.marked, FIXEDBIT));
      makewhite(g, curr);  /* make it white (for next cycle) */
      p = &curr->gch.next;
    }
    else {  /* must erase `curr' */
      lua_assert(isdead(g, curr) || deadmask == bitmask(SFIXEDBIT));
      *p = curr->gch.next;
      if (curr == g->rootgc)  /* is the first element of the list? */
        g->rootgc = curr->gch.next;  /* adjust first */
      freeobj(L, curr);
    }
  }
  return p;
}